

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_pi_value(xml_buffered_writer *writer,char_t *s)

{
  char_t *data;
  bool bVar1;
  char_t *prev;
  char_t *s_local;
  xml_buffered_writer *writer_local;
  
  prev = s;
  while( true ) {
    do {
      data = prev;
      if (*prev == '\0') {
        return;
      }
      while( true ) {
        bVar1 = false;
        if (*prev != '\0') {
          bVar1 = false;
          if (*prev == '?') {
            bVar1 = prev[1] == '>';
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (!bVar1) break;
        prev = prev + 1;
      }
      xml_buffered_writer::write_buffer(writer,data,(long)prev - (long)data);
    } while (*prev == '\0');
    bVar1 = false;
    if (*prev == '?') {
      bVar1 = prev[1] == '>';
    }
    if (!bVar1) break;
    xml_buffered_writer::write(writer,0x3f,(void *)0x20,0x3e);
    prev = prev + 2;
  }
  __assert_fail("s[0] == \'?\' && s[1] == \'>\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0xfe2,
                "void pugi::impl::(anonymous namespace)::node_output_pi_value(xml_buffered_writer &, const char_t *)"
               );
}

Assistant:

PUGI__FN void node_output_pi_value(xml_buffered_writer& writer, const char_t* s)
	{
		while (*s)
		{
			const char_t* prev = s;

			// look for ?> sequence - we can't output it since ?> terminates PI
			while (*s && !(s[0] == '?' && s[1] == '>')) ++s;

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			if (*s)
			{
				assert(s[0] == '?' && s[1] == '>');

				writer.write('?', ' ', '>');
				s += 2;
			}
		}
	}